

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

void SHA1_transform(ON__UINT32 *state,ON__UINT8 *block)

{
  ON__UINT32 OVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint local_78;
  uint local_74;
  ON__UINT32 workspace16 [16];
  ON__UINT32 e;
  ON__UINT32 d;
  ON__UINT32 c;
  ON__UINT32 b;
  ON__UINT32 a;
  ON__UINT8 *block_local;
  ON__UINT32 *state_local;
  
  uVar5 = *state;
  uVar3 = state[1];
  uVar6 = state[2];
  uVar4 = state[3];
  OVar1 = state[4];
  memcpy(&local_78,block,0x40);
  uVar7 = local_78 << 0x18 | local_78 >> 8 & 0xff00ff00 |
          (local_78 & 0xff00) << 8 | local_78 >> 0x18;
  uVar2 = (uVar3 & (uVar6 ^ uVar4) ^ uVar4) + uVar7 + 0x5a827999 + (uVar5 << 5 | uVar5 >> 0x1b) +
          OVar1;
  uVar3 = uVar3 << 0x1e | uVar3 >> 2;
  uVar8 = local_74 << 0x18 | local_74 >> 8 & 0xff00ff00 |
          (local_74 & 0xff00) << 8 | local_74 >> 0x18;
  uVar4 = (uVar5 & (uVar3 ^ uVar6) ^ uVar6) + uVar8 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 << 0x1e | uVar5 >> 2;
  uVar9 = workspace16[0] << 0x18 | workspace16[0] >> 8 & 0xff00ff00 |
          (workspace16[0] & 0xff00) << 8 | workspace16[0] >> 0x18;
  uVar6 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar9 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar10 = workspace16[1] << 0x18 | workspace16[1] >> 8 & 0xff00ff00 |
           (workspace16[1] & 0xff00) << 8 | workspace16[1] >> 0x18;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar10 + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar11 = workspace16[2] << 0x18 | workspace16[2] >> 8 & 0xff00ff00 |
           (workspace16[2] & 0xff00) << 8 | workspace16[2] >> 0x18;
  uVar5 = (uVar6 & (uVar4 ^ uVar2) ^ uVar2) + uVar11 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar12 = workspace16[3] << 0x18 | workspace16[3] >> 8 & 0xff00ff00 |
           (workspace16[3] & 0xff00) << 8 | workspace16[3] >> 0x18;
  uVar2 = (uVar3 & (uVar6 ^ uVar4) ^ uVar4) + uVar12 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar13 = workspace16[4] << 0x18 | workspace16[4] >> 8 & 0xff00ff00 |
           (workspace16[4] & 0xff00) << 8 | workspace16[4] >> 0x18;
  uVar4 = (uVar5 & (uVar3 ^ uVar6) ^ uVar6) + uVar13 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar14 = workspace16[5] << 0x18 | workspace16[5] >> 8 & 0xff00ff00 |
           (workspace16[5] & 0xff00) << 8 | workspace16[5] >> 0x18;
  uVar6 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar14 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar15 = workspace16[6] << 0x18 | workspace16[6] >> 8 & 0xff00ff00 |
           (workspace16[6] & 0xff00) << 8 | workspace16[6] >> 0x18;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar15 + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar16 = workspace16[7] << 0x18 | workspace16[7] >> 8 & 0xff00ff00 |
           (workspace16[7] & 0xff00) << 8 | workspace16[7] >> 0x18;
  uVar5 = (uVar6 & (uVar4 ^ uVar2) ^ uVar2) + uVar16 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar17 = workspace16[8] << 0x18 | workspace16[8] >> 8 & 0xff00ff00 |
           (workspace16[8] & 0xff00) << 8 | workspace16[8] >> 0x18;
  uVar2 = (uVar3 & (uVar6 ^ uVar4) ^ uVar4) + uVar17 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar18 = workspace16[9] << 0x18 | workspace16[9] >> 8 & 0xff00ff00 |
           (workspace16[9] & 0xff00) << 8 | workspace16[9] >> 0x18;
  uVar4 = (uVar5 & (uVar3 ^ uVar6) ^ uVar6) + uVar18 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar19 = workspace16[10] << 0x18 | workspace16[10] >> 8 & 0xff00ff00 |
           (workspace16[10] & 0xff00) << 8 | workspace16[10] >> 0x18;
  uVar6 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar19 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar20 = workspace16[0xb] << 0x18 | workspace16[0xb] >> 8 & 0xff00ff00 |
           (workspace16[0xb] & 0xff00) << 8 | workspace16[0xb] >> 0x18;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar20 + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar21 = workspace16[0xc] << 0x18 | workspace16[0xc] >> 8 & 0xff00ff00 |
           (workspace16[0xc] & 0xff00) << 8 | workspace16[0xc] >> 0x18;
  uVar5 = (uVar6 & (uVar4 ^ uVar2) ^ uVar2) + uVar21 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar22 = workspace16[0xd] << 0x18 | workspace16[0xd] >> 8 & 0xff00ff00 |
           (workspace16[0xd] & 0xff00) << 8 | workspace16[0xd] >> 0x18;
  uVar2 = (uVar3 & (uVar6 ^ uVar4) ^ uVar4) + uVar22 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar4 = (uVar5 & (uVar3 ^ uVar6) ^ uVar6) + uVar7 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar6 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar8 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar9 = (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar9 + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar5 = (uVar6 & (uVar4 ^ uVar2) ^ uVar2) + uVar10 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar11 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar12 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar13 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar14 = (uVar11 ^ uVar22 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar22 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar14 + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar15 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar16 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar17 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar18 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar19 + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar22 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar22 ^ uVar20) >> 0x1f;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar20 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar21 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar22 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar22) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar22) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar22 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar8 + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar9 = (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar9 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar10 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar11 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar12 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar13 + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar14 = (uVar11 ^ uVar22 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar22 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar14 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar2 = ((uVar3 | uVar6) & uVar4 | uVar3 & uVar6) + uVar15 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar6 | uVar5 & uVar3) + uVar16 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar6 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar17 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar18 + -0x70e44324 +
          (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar5 = ((uVar6 | uVar4) & uVar2 | uVar6 & uVar4) + uVar19 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar22 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar22 ^ uVar20) >> 0x1f;
  uVar2 = ((uVar3 | uVar6) & uVar4 | uVar3 & uVar6) + uVar20 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar6 | uVar5 & uVar3) + uVar21 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar22 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar22) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar22) >> 0x1f;
  uVar6 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar22 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar7 + -0x70e44324 +
          (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar5 = ((uVar6 | uVar4) & uVar2 | uVar6 & uVar4) + uVar8 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar9 = (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar2 = ((uVar3 | uVar6) & uVar4 | uVar3 & uVar6) + uVar9 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar6 | uVar5 & uVar3) + uVar10 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar6 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar11 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar12 + -0x70e44324 +
          (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar5 = ((uVar6 | uVar4) & uVar2 | uVar6 & uVar4) + uVar13 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar14 = (uVar11 ^ uVar22 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar22 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar2 = ((uVar3 | uVar6) & uVar4 | uVar3 & uVar6) + uVar14 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar6 | uVar5 & uVar3) + uVar15 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar6 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar16 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar17 + -0x70e44324 +
          (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar5 = ((uVar6 | uVar4) & uVar2 | uVar6 & uVar4) + uVar18 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar19 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar22 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar22 ^ uVar20) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar20 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar21 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar22 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar22) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar22) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar22 + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar23 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar23 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar8 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar7 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar9 = (uVar23 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar23 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar9 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar10 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar10 + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar11 = (uVar7 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar7 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar11 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar12 = (uVar9 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar9 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar12 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar13 = (uVar10 ^ uVar22 ^ uVar16 ^ uVar14) << 1 | (uVar10 ^ uVar22 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar13 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar14 = (uVar11 ^ uVar23 ^ uVar17 ^ uVar15) << 1 | (uVar11 ^ uVar23 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar14 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar15 = (uVar12 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar12 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar15 + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar16 = (uVar13 ^ uVar7 ^ uVar19 ^ uVar17) << 1 | (uVar13 ^ uVar7 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar16 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar9 = (uVar14 ^ uVar9 ^ uVar20 ^ uVar18) << 1 | (uVar14 ^ uVar9 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar9 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar7 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar10 = (uVar15 ^ uVar10 ^ uVar21 ^ uVar19) << 1 | (uVar15 ^ uVar10 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar4 = (uVar5 ^ uVar7 ^ uVar6) + uVar10 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (uVar2 ^ uVar5 ^ uVar7) +
          ((uVar16 ^ uVar11 ^ uVar22 ^ uVar20) << 1 | (uVar16 ^ uVar11 ^ uVar22 ^ uVar20) >> 0x1f) +
          -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar3 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (uVar4 ^ uVar3 ^ uVar5) +
          ((uVar9 ^ uVar12 ^ uVar23 ^ uVar21) << 1 | (uVar9 ^ uVar12 ^ uVar23 ^ uVar21) >> 0x1f) +
          -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar7;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  *state = (uVar6 ^ uVar4 ^ uVar3) +
           ((uVar10 ^ uVar13 ^ uVar8 ^ uVar22) << 1 | (uVar10 ^ uVar13 ^ uVar8 ^ uVar22) >> 0x1f) +
           -0x359d3e2a + (uVar7 * 0x20 | uVar7 >> 0x1b) + uVar5 + *state;
  state[1] = uVar7 + state[1];
  state[2] = (uVar6 * 0x40000000 | uVar6 >> 2) + state[2];
  state[3] = uVar4 + state[3];
  state[4] = uVar3 + state[4];
  return;
}

Assistant:

static void SHA1_transform(ON__UINT32 state[5], const ON__UINT8 block[64])
{
	ON__UINT32 a = state[0], b = state[1], c = state[2], d = state[3], e = state[4];
  ON__UINT32 workspace16[16];

	memcpy(workspace16, block, 64);

	// 4 rounds of 20 operations each, loop unrolled
	S_R0(a,b,c,d,e, 0); S_R0(e,a,b,c,d, 1); S_R0(d,e,a,b,c, 2); S_R0(c,d,e,a,b, 3);
	S_R0(b,c,d,e,a, 4); S_R0(a,b,c,d,e, 5); S_R0(e,a,b,c,d, 6); S_R0(d,e,a,b,c, 7);
	S_R0(c,d,e,a,b, 8); S_R0(b,c,d,e,a, 9); S_R0(a,b,c,d,e,10); S_R0(e,a,b,c,d,11);
	S_R0(d,e,a,b,c,12); S_R0(c,d,e,a,b,13); S_R0(b,c,d,e,a,14); S_R0(a,b,c,d,e,15);
	S_R1(e,a,b,c,d,16); S_R1(d,e,a,b,c,17); S_R1(c,d,e,a,b,18); S_R1(b,c,d,e,a,19);
	S_R2(a,b,c,d,e,20); S_R2(e,a,b,c,d,21); S_R2(d,e,a,b,c,22); S_R2(c,d,e,a,b,23);
	S_R2(b,c,d,e,a,24); S_R2(a,b,c,d,e,25); S_R2(e,a,b,c,d,26); S_R2(d,e,a,b,c,27);
	S_R2(c,d,e,a,b,28); S_R2(b,c,d,e,a,29); S_R2(a,b,c,d,e,30); S_R2(e,a,b,c,d,31);
	S_R2(d,e,a,b,c,32); S_R2(c,d,e,a,b,33); S_R2(b,c,d,e,a,34); S_R2(a,b,c,d,e,35);
	S_R2(e,a,b,c,d,36); S_R2(d,e,a,b,c,37); S_R2(c,d,e,a,b,38); S_R2(b,c,d,e,a,39);
	S_R3(a,b,c,d,e,40); S_R3(e,a,b,c,d,41); S_R3(d,e,a,b,c,42); S_R3(c,d,e,a,b,43);
	S_R3(b,c,d,e,a,44); S_R3(a,b,c,d,e,45); S_R3(e,a,b,c,d,46); S_R3(d,e,a,b,c,47);
	S_R3(c,d,e,a,b,48); S_R3(b,c,d,e,a,49); S_R3(a,b,c,d,e,50); S_R3(e,a,b,c,d,51);
	S_R3(d,e,a,b,c,52); S_R3(c,d,e,a,b,53); S_R3(b,c,d,e,a,54); S_R3(a,b,c,d,e,55);
	S_R3(e,a,b,c,d,56); S_R3(d,e,a,b,c,57); S_R3(c,d,e,a,b,58); S_R3(b,c,d,e,a,59);
	S_R4(a,b,c,d,e,60); S_R4(e,a,b,c,d,61); S_R4(d,e,a,b,c,62); S_R4(c,d,e,a,b,63);
	S_R4(b,c,d,e,a,64); S_R4(a,b,c,d,e,65); S_R4(e,a,b,c,d,66); S_R4(d,e,a,b,c,67);
	S_R4(c,d,e,a,b,68); S_R4(b,c,d,e,a,69); S_R4(a,b,c,d,e,70); S_R4(e,a,b,c,d,71);
	S_R4(d,e,a,b,c,72); S_R4(c,d,e,a,b,73); S_R4(b,c,d,e,a,74); S_R4(a,b,c,d,e,75);
	S_R4(e,a,b,c,d,76); S_R4(d,e,a,b,c,77); S_R4(c,d,e,a,b,78); S_R4(b,c,d,e,a,79);

	// Add the working vars back into state
	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;
}